

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::QueueDeleteMethod::eval
          (QueueDeleteMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  int iVar1;
  SourceRange range;
  bool bVar2;
  ConstantValue *pCVar3;
  SourceLocation SVar4;
  size_type sVar5;
  SourceLocation diag;
  _Optional_payload_base<int> this_00;
  int *piVar6;
  reference ppEVar7;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  optional<int> index;
  ConstantValue ci;
  SVQueue *q;
  ConstantValue *target;
  LValue lval;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffcc8;
  EvalContext *in_stack_fffffffffffffcd0;
  Expression *in_stack_fffffffffffffcd8;
  _Self *__x;
  Diagnostic *in_stack_fffffffffffffce0;
  LValue *in_stack_fffffffffffffce8;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffcf0;
  const_iterator *in_stack_fffffffffffffd00;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffd08;
  DiagCode code;
  undefined1 local_288 [64];
  _Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>
  local_248 [32];
  SourceLocation local_228;
  SourceLocation SStack_220;
  undefined4 local_20c;
  _Optional_payload_base<int> local_208;
  SVQueue *local_1d8;
  ConstantValue *local_1d0;
  undefined4 local_1c8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  
  local_30 = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  bVar2 = LValue::operator_cast_to_bool((LValue *)0xaddd3a);
  if (!bVar2) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_1c8 = 1;
    goto LAB_00ade075;
  }
  pCVar3 = LValue::resolve(in_stack_fffffffffffffce8);
  local_1d0 = pCVar3;
  SVar4 = (SourceLocation)slang::ConstantValue::queue((ConstantValue *)0xadddbb);
  code = SUB84((ulong)pCVar3 >> 0x20,0);
  local_1d8 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0xadddcc);
  sVar5 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xaddde1);
  if (sVar5 == 1) {
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::clear
              (in_stack_fffffffffffffcf0);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_1c8 = 1;
    goto LAB_00ade075;
  }
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,1);
  Expression::eval(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  diag = (SourceLocation)slang::ConstantValue::integer((ConstantValue *)0xadde4d);
  this_00 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)in_stack_fffffffffffffce8);
  local_208 = this_00;
  bVar2 = std::optional::operator_cast_to_bool((optional<int> *)0xadde7f);
  if ((bVar2) && (piVar6 = std::optional<int>::operator*((optional<int> *)0xadde92), -1 < *piVar6))
  {
    piVar6 = std::optional<int>::operator*((optional<int> *)0xaddea4);
    iVar1 = *piVar6;
    sVar5 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       0xaddeb9);
    if (sVar5 <= (ulong)(long)iVar1) goto LAB_00addeca;
    pCVar3 = (ConstantValue *)local_288;
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin
              (in_stack_fffffffffffffcc8);
    std::optional<int>::operator*((optional<int> *)0xade003);
    __x = (_Self *)(local_288 + 0x20);
    std::operator+(__x,(difference_type)pCVar3);
    std::
    _Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>::
    _Deque_iterator<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
              (local_248,__x);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::erase
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    slang::ConstantValue::ConstantValue(pCVar3,in_stack_fffffffffffffcc8);
  }
  else {
LAB_00addeca:
    local_20c = 0x23000c;
    ppEVar7 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (local_30,1);
    local_228 = ((*ppEVar7)->sourceRange).startLoc;
    SStack_220 = ((*ppEVar7)->sourceRange).endLoc;
    range.endLoc = SVar4;
    range.startLoc = diag;
    EvalContext::addDiag((EvalContext *)this_00,code,range);
    Diagnostic::operator<<
              ((Diagnostic *)in_stack_fffffffffffffcd0,(ConstantValue *)in_stack_fffffffffffffcc8);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,0);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xaddf61);
    ast::operator<<((Diagnostic *)diag,(Type *)this_00);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0xaddf82);
    Diagnostic::operator<<<unsigned_long>
              (in_stack_fffffffffffffce0,(unsigned_long)in_stack_fffffffffffffcd8);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  local_1c8 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xade075);
LAB_00ade075:
  LValue::~LValue((LValue *)0xade082);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        auto target = lval.resolve();
        SLANG_ASSERT(target && target->isQueue());
        auto& q = *target->queue();

        // If no arguments, clear the queue.
        if (args.size() == 1) {
            q.clear();
            return nullptr;
        }

        auto ci = args[1]->eval(context);
        std::optional<int32_t> index = ci.integer().as<int32_t>();
        if (!index || *index < 0 || size_t(*index) >= q.size()) {
            context.addDiag(diag::ConstEvalDynamicArrayIndex, args[1]->sourceRange)
                << ci << *args[0]->type << q.size();
            return nullptr;
        }

        q.erase(q.begin() + *index);
        return nullptr;
    }